

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

bool __thiscall
Clasp::mt::SharedLitsClause::updateWatch(SharedLitsClause *this,Solver *s,uint32 pos)

{
  Literal *pLVar1;
  bool bVar2;
  uint *puVar3;
  Literal *rhs;
  uint in_EDX;
  SharedLiterals *in_RDI;
  Literal *end;
  Literal *r;
  Literal other;
  Literal *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  uint32 in_stack_ffffffffffffffac;
  Literal in_stack_ffffffffffffffb4;
  uint local_3c [2];
  uint32 local_34;
  Literal *local_30;
  Literal *local_28;
  uint32 local_20;
  uint local_1c;
  
  local_20 = (&in_RDI[2].size_type_)[in_EDX ^ 1];
  local_1c = in_EDX;
  local_28 = SharedLiterals::begin((SharedLiterals *)in_RDI[1]);
  local_30 = SharedLiterals::end(in_RDI);
  while( true ) {
    if (local_28 == local_30) {
      return false;
    }
    local_34 = local_28->rep_;
    bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffb4);
    if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,in_stack_ffffffffffffff98), bVar2))
    break;
    local_28 = local_28 + 1;
  }
  (&in_RDI[2].size_type_)[local_1c] = local_28->rep_;
  local_3c[1] = 8;
  local_3c[0] = (uint)((ulong)((long)local_30 - (long)local_28) >> 2);
  puVar3 = std::min<unsigned_int>(local_3c + 1,local_3c);
  rhs = (Literal *)(ulong)(*puVar3 - 2);
  switch(rhs) {
  case (Literal *)0x0:
    goto switchD_0022e7b0_caseD_0;
  case (Literal *)0x1:
    break;
  case (Literal *)0x6:
    local_28 = local_28 + 1;
    bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffb4);
    if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs), bVar2)) {
      in_RDI[3].size_type_ = local_28->rep_;
      return true;
    }
  case (Literal *)0x5:
    local_28 = local_28 + 1;
    bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffb4);
    if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs), bVar2)) {
      in_RDI[3].size_type_ = local_28->rep_;
      return true;
    }
  case (Literal *)0x4:
    local_28 = local_28 + 1;
    bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffb4);
    if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs), bVar2)) {
      in_RDI[3].size_type_ = local_28->rep_;
      return true;
    }
  case (Literal *)0x3:
    in_stack_ffffffffffffffb4.rep_ = local_28[1].rep_;
    local_28 = local_28 + 1;
    bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffb4);
    if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs), bVar2)) {
      in_RDI[3].size_type_ = local_28->rep_;
      return true;
    }
  case (Literal *)0x2:
    local_28 = local_28 + 1;
    bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                            in_stack_ffffffffffffffb4);
    if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs), bVar2)) {
      in_RDI[3].size_type_ = local_28->rep_;
      return true;
    }
    break;
  default:
    return true;
  }
  in_stack_ffffffffffffffac = local_28[1].rep_;
  local_28 = local_28 + 1;
  bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffb4);
  if ((!bVar2) && (bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs), bVar2)) {
    in_RDI[3].size_type_ = local_28->rep_;
    return true;
  }
switchD_0022e7b0_caseD_0:
  pLVar1 = local_28 + 1;
  local_28 = local_28 + 1;
  bVar2 = Solver::isFalse((Solver *)CONCAT44(in_stack_ffffffffffffffac,pLVar1->rep_),
                          in_stack_ffffffffffffffb4);
  if (bVar2) {
    return true;
  }
  bVar2 = Clasp::operator!=((Literal *)in_RDI,rhs);
  if (!bVar2) {
    return true;
  }
  in_RDI[3].size_type_ = local_28->rep_;
  return true;
}

Assistant:

bool SharedLitsClause::updateWatch(Solver& s, uint32 pos) {
	Literal  other = head_[1^pos];
	for (const Literal* r = shared_->begin(), *end = shared_->end(); r != end; ++r) {
		// at this point we know that head_[2] is false, so we only need to check
		// that we do not watch the other watched literal twice!
		if (!s.isFalse(*r) && *r != other) {
			head_[pos] = *r; // replace watch
			// try to replace cache literal
			switch( std::min(static_cast<uint32>(8), static_cast<uint32>(end-r)) ) {
				case 8: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 7: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 6: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 5: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 4: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 3: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				case 2: if (!s.isFalse(*++r) && *r != other) { head_[2] = *r; return true; } // FALLTHROUGH
				default: return true;
			}
		}
	}
	return false;
}